

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

FuncVec * __thiscall
dg::llvmdg::LLVMPTACallGraphImpl::callees
          (FuncVec *__return_storage_ptr__,LLVMPTACallGraphImpl *this,Function *F)

{
  pointer ppFVar1;
  FuncNode *pFVar2;
  pointer ppFVar3;
  Function *local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = F;
  pFVar2 = GenericCallGraph<const_llvm::Function_*>::get(&this->_cg,&local_20);
  ppFVar1 = (pFVar2->_calls).
            super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar3 = (pFVar2->_calls).
                 super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar3 != ppFVar1;
      ppFVar3 = ppFVar3 + 1) {
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
              (__return_storage_ptr__,&(*ppFVar3)->value);
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        const auto *fnd = _cg.get(F);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(nd->getValue());
        }
        return ret;
    }